

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_umax_i32_riscv64(TCGContext_conflict11 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a,TCGv_i32 b)

{
  tcg_gen_movcond_i32_riscv64(tcg_ctx,TCG_COND_LTU,ret,a,b,b,a);
  return;
}

Assistant:

void tcg_gen_umax_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a, TCGv_i32 b)
{
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LTU, ret, a, b, b, a);
}